

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O1

int parse_rockridge(archive_read *a,file_info *file,uchar *p,uchar *end)

{
  archive_string *as;
  archive_string *as_00;
  ulong *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  time_t tVar14;
  void *__dest;
  ulong uVar15;
  uint uVar16;
  ulong *puVar17;
  ulong uVar18;
  byte *pbVar19;
  int iVar20;
  char *pcVar21;
  long lVar22;
  int local_5c;
  
  pvVar6 = a->format->data;
  as = &file->symlink;
  as_00 = &file->name;
  bVar10 = false;
  do {
    pbVar19 = p + 4;
    if (((end < pbVar19) || (bVar2 = *p, 0x19 < (byte)(bVar2 + 0xbf))) ||
       (bVar3 = p[1], 0x19 < (byte)(bVar3 + 0xbf))) {
LAB_00125e3c:
      if (bVar10) {
        return 0;
      }
      archive_set_error(&a->archive,0x54,"Tried to parse Rockridge extensions, but none found");
      return -0x14;
    }
    bVar4 = p[2];
    if (((ulong)bVar4 < 4) || (end < p + bVar4)) goto LAB_00125e3c;
    bVar5 = p[3];
    if (0xc < bVar2 - 0x4e) {
      if (bVar2 == 0x43) {
        if (bVar3 == 0x4c) {
          if (bVar4 == 0xc && bVar5 == 1) {
            file->cl_offset = (ulong)*(uint *)(p + 4) * *(long *)((long)pvVar6 + 0xa8);
            *(undefined1 *)((long)pvVar6 + 0x28) = 1;
          }
        }
        else if ((bVar3 == 0x45) && (bVar4 == 0x1c && bVar5 == 1)) {
          bVar2 = p[7];
          bVar3 = p[6];
          bVar4 = p[5];
          bVar5 = p[4];
          uVar16 = *(uint *)(p + 0xc);
          file->ce_offset = uVar16;
          uVar11 = *(uint *)(p + 0x14);
          file->ce_size = uVar11;
          pvVar7 = a->format->data;
          uVar18 = ((ulong)bVar4 << 8 | (long)(int)((uint)bVar2 << 0x18) | (ulong)bVar3 << 0x10 |
                   (ulong)bVar5) * *(ulong *)((long)pvVar7 + 0xa8);
          if ((((file->mode & 0xf000) == 0x8000) && (file->offset <= uVar18)) ||
             (((uVar18 < *(ulong *)((long)pvVar7 + 0xa0) ||
               (uVar13 = (ulong)uVar11 + (ulong)uVar16, *(ulong *)((long)pvVar7 + 0xa8) < uVar13))
              || (*(ulong *)((long)pvVar7 + 0xb0) < uVar13 + uVar18)))) {
            archive_set_error(&a->archive,-1,"Invalid parameter in SUSP \"CE\" extension");
LAB_001256e3:
            bVar9 = false;
          }
          else {
            iVar20 = *(int *)((long)pvVar7 + 0x40);
            iVar12 = *(int *)((long)pvVar7 + 0x44);
            if (iVar12 <= iVar20) {
              uVar16 = iVar12 * 2;
              if (iVar12 < 0x10) {
                uVar16 = 0x10;
              }
              if (((int)uVar16 <= iVar12) ||
                 (__dest = calloc((ulong)uVar16,0x10), __dest == (void *)0x0)) {
                archive_set_error(&a->archive,0xc,"Out of memory");
                goto LAB_001256e3;
              }
              if (*(void **)((long)pvVar7 + 0x38) != (void *)0x0) {
                memcpy(__dest,*(void **)((long)pvVar7 + 0x38),(long)iVar20 << 4);
                free(*(void **)((long)pvVar7 + 0x38));
              }
              *(void **)((long)pvVar7 + 0x38) = __dest;
              *(uint *)((long)pvVar7 + 0x44) = uVar16;
            }
            uVar16 = *(uint *)((long)pvVar7 + 0x40);
            *(uint *)((long)pvVar7 + 0x40) = uVar16 + 1;
            uVar13 = (ulong)uVar16;
            if (0 < (int)uVar16) {
              do {
                uVar16 = (int)uVar13 - 1;
                uVar15 = (ulong)(uVar16 >> 1);
                lVar8 = *(long *)((long)pvVar7 + 0x38);
                lVar22 = uVar15 * 0x10;
                puVar1 = (ulong *)(lVar8 + uVar13 * 0x10);
                if (*(ulong *)(lVar8 + lVar22) <= uVar18) {
                  *puVar1 = uVar18;
                  *(file_info **)(lVar8 + 8 + uVar13 * 0x10) = file;
                  goto LAB_00125e35;
                }
                puVar17 = (ulong *)(lVar8 + lVar22);
                uVar13 = puVar17[1];
                *puVar1 = *puVar17;
                puVar1[1] = uVar13;
                uVar13 = uVar15;
              } while (1 < uVar16);
            }
            puVar1 = *(ulong **)((long)pvVar7 + 0x38);
            *puVar1 = uVar18;
            puVar1[1] = (ulong)file;
LAB_00125e35:
            bVar9 = true;
          }
          if (!bVar9) {
            local_5c = -0x1e;
            goto LAB_00125a50;
          }
        }
      }
      goto switchD_00125596_caseD_4f;
    }
    uVar16 = (uint)bVar4;
    switch((uint)bVar2) {
    case 0x4e:
      if (bVar5 != 1 || bVar3 != 0x4d) break;
      if (file->name_continues == '\0') {
        (file->name).length = 0;
      }
      file->name_continues = '\0';
      if (bVar4 < 5) goto switchD_001255e7_caseD_3;
      switch(*pbVar19) {
      case 0:
        if (bVar4 != 5) {
          archive_strncat(as_00,p + 5,(ulong)(uVar16 - 5));
        }
        break;
      case 1:
        if (bVar4 != 5) {
          archive_strncat(as_00,p + 5,(ulong)(uVar16 - 5));
          file->name_continues = '\x01';
        }
        break;
      case 2:
        pcVar21 = ".";
        goto LAB_00125c06;
      case 4:
        pcVar21 = "..";
LAB_00125c06:
        archive_strcat(as_00,pcVar21);
      }
switchD_001255e7_caseD_3:
      *(undefined1 *)((long)pvVar6 + 0x28) = 1;
      break;
    case 0x50:
      if (bVar3 == 0x4e) {
        if (bVar4 == 0x14 && bVar5 == 1) {
          uVar16 = toi(pbVar19,4);
          file->rdev = (ulong)uVar16 << 0x20;
          uVar11 = toi(p + 0xc,4);
          file->rdev = CONCAT44(uVar16,uVar11);
          goto switchD_001255e7_caseD_3;
        }
      }
      else if (bVar5 == 1 && bVar3 == 0x58) {
        if (0xb < bVar4) {
          uVar16 = toi(pbVar19,4);
          file->mode = uVar16;
        }
        if (0x13 < bVar4) {
          uVar16 = toi(p + 0xc,4);
          file->nlinks = uVar16;
        }
        if (0x1b < bVar4) {
          uVar16 = toi(p + 0x14,4);
          file->uid = uVar16;
        }
        if (0x23 < bVar4) {
          uVar16 = toi(p + 0x1c,4);
          file->gid = uVar16;
        }
        if (0x2b < bVar4) {
          uVar16 = toi(p + 0x24,4);
          file->number = (ulong)uVar16;
        }
        *(undefined1 *)((long)pvVar6 + 0x28) = 1;
      }
      break;
    case 0x52:
      if (bVar5 == 1 && bVar3 == 0x45) {
        file->re = '\x01';
        *(undefined1 *)((long)pvVar6 + 0x28) = 1;
      }
      break;
    case 0x53:
      if (bVar3 == 0x4c) {
        if (bVar5 == 1) {
          if ((file->symlink_continues == '\0') || ((file->symlink).length == 0)) {
            (file->symlink).length = 0;
          }
          file->symlink_continues = '\0';
          if (4 < bVar4) {
            if (*pbVar19 != 0) {
              if (*pbVar19 != 1) goto LAB_001258f4;
              file->symlink_continues = '\x01';
            }
            pbVar19 = p + 5;
            iVar20 = uVar16 - 5;
            pcVar21 = "";
            do {
              if (iVar20 < 2) break;
              bVar2 = *pbVar19;
              bVar3 = pbVar19[1];
              uVar18 = (ulong)bVar3;
              pbVar19 = pbVar19 + 2;
              iVar20 = iVar20 + -2;
              archive_strcat(as,pcVar21);
              uVar16 = (uint)bVar3;
              switch(bVar2) {
              case 0:
                if (iVar20 < (int)uVar16) goto switchD_00125828_caseD_3;
                archive_strncat(as,pbVar19,uVar18);
                goto LAB_001258ba;
              case 1:
                if ((int)uVar16 <= iVar20) {
                  archive_strncat(as,pbVar19,uVar18);
                  goto LAB_001258d3;
                }
              case 3:
              case 5:
              case 6:
              case 7:
switchD_00125828_caseD_3:
                bVar10 = false;
                pcVar21 = "/";
                goto LAB_001258e5;
              case 2:
                pcVar21 = ".";
                break;
              case 4:
                pcVar21 = "..";
                break;
              case 8:
                archive_strcat(as,"/");
LAB_001258d3:
                pcVar21 = "";
                goto LAB_001258da;
              default:
                if (bVar2 == 0x10) {
                  (file->symlink).length = 0;
                  pcVar21 = "ROOT";
                }
                else {
                  if (bVar2 != 0x20) goto switchD_00125828_caseD_3;
                  pcVar21 = "hostname";
                }
              }
              archive_strcat(as,pcVar21);
LAB_001258ba:
              pcVar21 = "/";
LAB_001258da:
              pbVar19 = pbVar19 + uVar18;
              iVar20 = iVar20 - uVar16;
              bVar10 = true;
LAB_001258e5:
            } while (bVar10);
          }
LAB_001258f4:
          *(undefined1 *)((long)pvVar6 + 0x28) = 1;
        }
        break;
      }
      if (((bVar3 != 0x54) || (bVar4 != 4)) || (bVar5 != 1)) break;
      *(undefined2 *)((long)pvVar6 + 0x28) = 0;
      local_5c = 0;
LAB_00125a50:
      bVar9 = false;
      goto LAB_00125d16;
    case 0x54:
      if (bVar5 == 1 && bVar3 == 0x46) {
        if (4 < bVar4) {
          bVar2 = p[4];
          pbVar19 = p + 5;
          iVar20 = bVar4 - 5;
          if ((char)bVar2 < '\0') {
            if (0x15 < bVar4 && (bVar2 & 1) != 0) {
              iVar20 = isodate17_valid(pbVar19);
              if (iVar20 != 0) {
                *(byte *)&file->time_is_set = (byte)file->time_is_set | 1;
                tVar14 = isodate17(pbVar19);
                file->birthtime = tVar14;
              }
              pbVar19 = p + 0x16;
              iVar20 = uVar16 - 0x16;
            }
            if (((bVar2 & 2) != 0) && (0x10 < iVar20)) {
              iVar12 = isodate17_valid(pbVar19);
              if (iVar12 != 0) {
                *(byte *)&file->time_is_set = (byte)file->time_is_set | 2;
                tVar14 = isodate17(pbVar19);
                file->mtime = tVar14;
              }
              pbVar19 = pbVar19 + 0x11;
              iVar20 = iVar20 + -0x11;
            }
            if (((bVar2 & 4) != 0) && (0x10 < iVar20)) {
              iVar12 = isodate17_valid(pbVar19);
              if (iVar12 != 0) {
                *(byte *)&file->time_is_set = (byte)file->time_is_set | 4;
                tVar14 = isodate17(pbVar19);
                file->atime = tVar14;
              }
              pbVar19 = pbVar19 + 0x11;
              iVar20 = iVar20 + -0x11;
            }
            if ((((bVar2 & 8) != 0) && (0x10 < iVar20)) &&
               (iVar20 = isodate17_valid(pbVar19), iVar20 != 0)) {
              *(byte *)&file->time_is_set = (byte)file->time_is_set | 8;
              tVar14 = isodate17(pbVar19);
              goto LAB_00125cf3;
            }
          }
          else {
            if (0xb < bVar4 && (bVar2 & 1) != 0) {
              iVar20 = isodate7_valid(pbVar19);
              if (iVar20 != 0) {
                *(byte *)&file->time_is_set = (byte)file->time_is_set | 1;
                tVar14 = isodate7(pbVar19);
                file->birthtime = tVar14;
              }
              pbVar19 = p + 0xc;
              iVar20 = uVar16 - 0xc;
            }
            if (((bVar2 & 2) != 0) && (6 < iVar20)) {
              iVar12 = isodate7_valid(pbVar19);
              if (iVar12 != 0) {
                *(byte *)&file->time_is_set = (byte)file->time_is_set | 2;
                tVar14 = isodate7(pbVar19);
                file->mtime = tVar14;
              }
              pbVar19 = pbVar19 + 7;
              iVar20 = iVar20 + -7;
            }
            if (((bVar2 & 4) != 0) && (6 < iVar20)) {
              iVar12 = isodate7_valid(pbVar19);
              if (iVar12 != 0) {
                *(byte *)&file->time_is_set = (byte)file->time_is_set | 4;
                tVar14 = isodate7(pbVar19);
                file->atime = tVar14;
              }
              pbVar19 = pbVar19 + 7;
              iVar20 = iVar20 + -7;
            }
            if ((((bVar2 & 8) != 0) && (6 < iVar20)) &&
               (iVar20 = isodate7_valid(pbVar19), iVar20 != 0)) {
              *(byte *)&file->time_is_set = (byte)file->time_is_set | 8;
              tVar14 = isodate7(pbVar19);
LAB_00125cf3:
              file->ctime = tVar14;
            }
          }
        }
        goto switchD_001255e7_caseD_3;
      }
      break;
    case 0x5a:
      if (((bVar5 == 1 && bVar3 == 0x46) && (*pbVar19 == 0x70)) &&
         ((bVar4 == 0x10 && (p[5] == 0x7a)))) {
        file->pz = 1;
        file->pz_log2_bs = (uint)p[7];
        file->pz_uncompressed_size = (ulong)*(uint *)(p + 8);
      }
    }
switchD_00125596_caseD_4f:
    p = p + p[2];
    bVar9 = true;
    bVar10 = true;
LAB_00125d16:
    if (!bVar9) {
      return local_5c;
    }
  } while( true );
}

Assistant:

static int
parse_rockridge(struct archive_read *a, struct file_info *file,
    const unsigned char *p, const unsigned char *end)
{
	struct iso9660 *iso9660;
	int entry_seen = 0;

	iso9660 = (struct iso9660 *)(a->format->data);

	while (p + 4 <= end  /* Enough space for another entry. */
	    && p[0] >= 'A' && p[0] <= 'Z' /* Sanity-check 1st char of name. */
	    && p[1] >= 'A' && p[1] <= 'Z' /* Sanity-check 2nd char of name. */
	    && p[2] >= 4 /* Sanity-check length. */
	    && p + p[2] <= end) { /* Sanity-check length. */
		const unsigned char *data = p + 4;
		int data_length = p[2] - 4;
		int version = p[3];

		switch(p[0]) {
		case 'C':
			if (p[1] == 'E') {
				if (version == 1 && data_length == 24) {
					/*
					 * CE extension comprises:
					 *   8 byte sector containing extension
					 *   8 byte offset w/in above sector
					 *   8 byte length of continuation
					 */
					int32_t location =
					    archive_le32dec(data);
					file->ce_offset =
					    archive_le32dec(data+8);
					file->ce_size =
					    archive_le32dec(data+16);
					if (register_CE(a, location, file)
					    != ARCHIVE_OK)
						return (ARCHIVE_FATAL);
				}
			}
			else if (p[1] == 'L') {
				if (version == 1 && data_length == 8) {
					file->cl_offset = (uint64_t)
					    iso9660->logical_block_size *
					    (uint64_t)archive_le32dec(data);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'N':
			if (p[1] == 'M') {
				if (version == 1) {
					parse_rockridge_NM1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'P':
			/*
			 * PD extension is padding;
			 * contents are always ignored.
			 *
			 * PL extension won't appear;
			 * contents are always ignored.
			 */
			if (p[1] == 'N') {
				if (version == 1 && data_length == 16) {
					file->rdev = toi(data,4);
					file->rdev <<= 32;
					file->rdev |= toi(data + 8, 4);
					iso9660->seenRockridge = 1;
				}
			}
			else if (p[1] == 'X') {
				/*
				 * PX extension comprises:
				 *   8 bytes for mode,
				 *   8 bytes for nlinks,
				 *   8 bytes for uid,
				 *   8 bytes for gid,
				 *   8 bytes for inode.
				 */
				if (version == 1) {
					if (data_length >= 8)
						file->mode
						    = (__LA_MODE_T)toi(data, 4);
					if (data_length >= 16)
						file->nlinks
						    = toi(data + 8, 4);
					if (data_length >= 24)
						file->uid
						    = toi(data + 16, 4);
					if (data_length >= 32)
						file->gid
						    = toi(data + 24, 4);
					if (data_length >= 40)
						file->number
						    = toi(data + 32, 4);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'R':
			if (p[1] == 'E' && version == 1) {
				file->re = 1;
				iso9660->seenRockridge = 1;
			}
			else if (p[1] == 'R' && version == 1) {
				/*
				 * RR extension comprises:
				 *    one byte flag value
				 * This extension is obsolete,
				 * so contents are always ignored.
				 */
			}
			break;
		case 'S':
			if (p[1] == 'L') {
				if (version == 1) {
					parse_rockridge_SL1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			else if (p[1] == 'T'
			    && data_length == 0 && version == 1) {
				/*
				 * ST extension marks end of this
				 * block of SUSP entries.
				 *
				 * It allows SUSP to coexist with
				 * non-SUSP uses of the System
				 * Use Area by placing non-SUSP data
				 * after SUSP data.
				 */
				iso9660->seenSUSP = 0;
				iso9660->seenRockridge = 0;
				return (ARCHIVE_OK);
			}
			break;
		case 'T':
			if (p[1] == 'F') {
				if (version == 1) {
					parse_rockridge_TF1(file,
					    data, data_length);
					iso9660->seenRockridge = 1;
				}
			}
			break;
		case 'Z':
			if (p[1] == 'F') {
				if (version == 1)
					parse_rockridge_ZF1(file,
					    data, data_length);
			}
			break;
		default:
			break;
		}

		p += p[2];
		entry_seen = 1;
	}

	if (entry_seen)
		return (ARCHIVE_OK);
	else {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				  "Tried to parse Rockridge extensions, but none found");
		return (ARCHIVE_WARN);
	}
}